

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_sub.cpp
# Opt level: O2

long __thiscall
duckdb::DateSubTernaryOperator::Operation<duckdb::string_t,duckdb::date_t,duckdb::date_t,long>
          (DateSubTernaryOperator *this,string_t part,date_t startdate,date_t enddate,
          ValidityMask *mask,idx_t idx)

{
  bool bVar1;
  DatePartSpecifier DVar2;
  int64_t iVar3;
  NotImplementedException *this_00;
  date_t input;
  undefined4 in_register_00000084;
  allocator local_71;
  string_t part_local;
  string local_60;
  string local_40;
  
  part_local.value.pointer.ptr = (char *)part.value._0_8_;
  input.days = part.value._8_4_;
  part_local.value._0_8_ = this;
  bVar1 = Value::IsFinite<duckdb::date_t>(input);
  if ((bVar1) && (bVar1 = Value::IsFinite<duckdb::date_t>(startdate), bVar1)) {
    string_t::GetString_abi_cxx11_(&local_60,&part_local);
    DVar2 = GetDatePartSpecifier(&local_60);
    switch(DVar2) {
    case BEGIN_BIGINT:
    case ISOYEAR:
      iVar3 = DateSub::YearOperator::Operation<duckdb::date_t,duckdb::date_t,long>(input,startdate);
      break;
    case MONTH:
      iVar3 = DateSub::MonthOperator::Operation<duckdb::date_t,duckdb::date_t,long>(input,startdate)
      ;
      break;
    case DAY:
    case DOW:
    case ISODOW:
    case DOY:
    case JULIAN_DAY:
      iVar3 = DateSub::DayOperator::Operation<duckdb::date_t,duckdb::date_t,long>(input,startdate);
      break;
    case DECADE:
      iVar3 = DateSub::DecadeOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case CENTURY:
      iVar3 = DateSub::CenturyOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case MILLENNIUM:
      iVar3 = DateSub::MilleniumOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case MICROSECONDS:
      iVar3 = DateSub::MicrosecondsOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case MILLISECONDS:
      iVar3 = DateSub::MillisecondsOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case SECOND:
    case BEGIN_DOUBLE:
      iVar3 = DateSub::SecondsOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case MINUTE:
      iVar3 = DateSub::MinutesOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    case HOUR:
      iVar3 = DateSub::HoursOperator::Operation<duckdb::date_t,duckdb::date_t,long>(input,startdate)
      ;
      break;
    case WEEK:
    case YEARWEEK:
      iVar3 = DateSub::WeekOperator::Operation<duckdb::date_t,duckdb::date_t,long>(input,startdate);
      break;
    case QUARTER:
      iVar3 = DateSub::QuarterOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                        (input,startdate);
      break;
    default:
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_40,"Specifier type not implemented for DATESUB",&local_71);
      NotImplementedException::NotImplementedException(this_00,&local_40);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    TemplatedValidityMask<unsigned_long>::SetInvalid
              ((TemplatedValidityMask<unsigned_long> *)CONCAT44(in_register_00000084,enddate.days),
               (idx_t)mask);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static inline TR Operation(TS part, TA startdate, TB enddate, ValidityMask &mask, idx_t idx) {
		if (Value::IsFinite(startdate) && Value::IsFinite(enddate)) {
			return SubtractDateParts<TA, TB, TR>(GetDatePartSpecifier(part.GetString()), startdate, enddate);
		} else {
			mask.SetInvalid(idx);
			return TR();
		}
	}